

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::dispose
          (ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *this)

{
  Tuple<kj::String,_kj::Array<unsigned_long>_> *firstElement;
  RemoveConst<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *pRVar1;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pTVar2;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *endCopy;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *posCopy;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *ptrCopy;
  ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pTVar2 = this->endPtr;
  if (firstElement != (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0) {
    this->ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
    this->pos = (RemoveConst<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)0x0;
    this->endPtr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
    ArrayDisposer::dispose<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0x30,
               ((long)pTVar2 - (long)firstElement) / 0x30);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }